

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
     *this,int i)

{
  value_type vVar1;
  
  vVar1 = FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  return vVar1 / (this->right_).constant_;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}